

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::FileDescriptor::FindExtensionByName(FileDescriptor *this,string_view name)

{
  bool bVar1;
  FieldDescriptor *local_48;
  Symbol local_30;
  FieldDescriptor *local_28;
  FieldDescriptor *field;
  FileDescriptor *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (FileDescriptor *)name._M_len;
  field = (FieldDescriptor *)this;
  local_30.ptr_ =
       (SymbolBase *)
       FileDescriptorTables::
       FindNestedSymbol<google::protobuf::(anonymous_namespace)::ParentNameQuery>
                 (this->tables_,this,name);
  local_28 = Symbol::field_descriptor(&local_30);
  if ((local_28 == (FieldDescriptor *)0x0) ||
     (bVar1 = FieldDescriptor::is_extension(local_28), !bVar1)) {
    local_48 = (FieldDescriptor *)0x0;
  }
  else {
    local_48 = local_28;
  }
  return local_48;
}

Assistant:

const FieldDescriptor* FileDescriptor::FindExtensionByName(
    absl::string_view name) const {
  const FieldDescriptor* field =
      tables_->FindNestedSymbol(this, name).field_descriptor();
  return field != nullptr && field->is_extension() ? field : nullptr;
}